

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

uint32_t __thiscall testing::internal::Random::Generate(Random *this,uint32_t range)

{
  ostream *poVar1;
  GTestLog *this_00;
  GTestLog local_20;
  GTestLog local_1c;
  
  this->state_ = this->state_ * 0x41c64e6d + 0x3039 & 0x7fffffff;
  if (range == 0) {
    GTestLog::GTestLog(&local_1c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/ThirdParty/googletest/googletest/src/gtest.cc"
                       ,0x19a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition range > 0 failed. ",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Cannot generate a number in the range [0, 0).",0x2d);
    this_00 = &local_1c;
  }
  else {
    if (range < 0x80000001) goto LAB_0012ecb1;
    GTestLog::GTestLog(&local_20,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/ThirdParty/googletest/googletest/src/gtest.cc"
                       ,0x19b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition range <= kMaxRange failed. ",0x25);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Generation of a number in [0, ",0x1e);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,") was requested, ",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"but this can only generate numbers in [0, ",0x2a);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,").",2);
    this_00 = &local_20;
  }
  GTestLog::~GTestLog(this_00);
LAB_0012ecb1:
  return this->state_ % range;
}

Assistant:

uint32_t Random::Generate(uint32_t range) {
  // These constants are the same as are used in glibc's rand(3).
  // Use wider types than necessary to prevent unsigned overflow diagnostics.
  state_ = static_cast<uint32_t>(1103515245ULL * state_ + 12345U) % kMaxRange;

  GTEST_CHECK_(range > 0) << "Cannot generate a number in the range [0, 0).";
  GTEST_CHECK_(range <= kMaxRange)
      << "Generation of a number in [0, " << range << ") was requested, "
      << "but this can only generate numbers in [0, " << kMaxRange << ").";

  // Converting via modulus introduces a bit of downward bias, but
  // it's simple, and a linear congruential generator isn't too good
  // to begin with.
  return state_ % range;
}